

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

PtexFaceData * __thiscall Ptex::v2_4::PtexReader::getData(PtexReader *this,int faceid,Res res)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  pointer pFVar4;
  uint8_t *puVar5;
  Level **level;
  pointer ppLVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  PtexFaceData *pPVar11;
  FaceData *pFVar12;
  ulong uVar13;
  FaceData *pFVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined6 in_register_00000012;
  ulong uVar16;
  Level *pLVar17;
  long lVar18;
  char *pcVar19;
  int levelid;
  uint levelid_00;
  char cVar20;
  uint uVar21;
  size_t newMemUsed;
  size_t tableNewMemUsed;
  ReductionKey key;
  long local_50;
  uint local_44;
  size_t local_40;
  ReductionKey local_38;
  long *plVar15;
  
  uVar16 = CONCAT62(in_register_00000012,res);
  if (((faceid < 0) || (this->_ok == false)) ||
     (uVar7 = (ulong)(uint)faceid, (this->_header).nfaces <= (uint)faceid)) {
    pFVar12 = errorData(this,true);
    return &pFVar12->super_PtexFaceData;
  }
  pFVar4 = (this->_faceinfo).
           super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar1 = pFVar4[uVar7].flags;
  if (((bVar1 & 1) != 0) ||
     (cVar20 = (char)(uVar16 & 0xffffffff), (ushort)res < 0x100 && cVar20 == '\0')) {
    pPVar11 = (PtexFaceData *)operator_new(0x18);
    iVar10 = this->_pixelsize;
    puVar5 = this->_constdata;
    pPVar11->_vptr_PtexFaceData = (_func_int **)&PTR__PtexFaceData_00117d28;
    pPVar11[1]._vptr_PtexFaceData = (_func_int **)(puVar5 + faceid * iVar10);
    *(int *)&pPVar11[2]._vptr_PtexFaceData = iVar10;
    return pPVar11;
  }
  uVar21 = (uint)uVar16;
  cVar8 = (char)((uVar16 & 0xffffffff) >> 8);
  pFVar4 = pFVar4 + uVar7;
  cVar2 = (pFVar4->res).ulog2;
  cVar3 = (pFVar4->res).vlog2;
  if (cVar3 == cVar8 && cVar2 == cVar20) {
    level = (this->_levels).
            super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pLVar17 = *level;
    if (pLVar17 == (Level *)0x0) {
      readLevel(this,0,level);
      pLVar17 = *level;
    }
    pFVar12 = getFace(this,0,pLVar17,faceid,res);
    return &pFVar12->super_PtexFaceData;
  }
  levelid_00 = (int)cVar2 - (int)cVar20;
  local_44 = (int)cVar3 - (int)cVar8;
  if (((bVar1 & 2) == 0) && (levelid_00 == local_44)) {
    uVar13 = (ulong)(int)levelid_00;
    ppLVar6 = (this->_levels).
              super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar13 < (ulong)((long)(this->_levels).
                               super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3)) {
      pLVar17 = ppLVar6[uVar13];
      if (pLVar17 == (Level *)0x0) {
        readLevel(this,levelid_00,ppLVar6 + uVar13);
        pLVar17 = ppLVar6[uVar13];
      }
      uVar9 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar7];
      if (((ulong)(long)(int)uVar9 <
           (ulong)((long)(pLVar17->faces).
                         super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pLVar17->faces).
                         super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
         (pFVar12 = getFace(this,levelid_00,pLVar17,uVar9,res), pFVar12 != (FaceData *)0x0)) {
        return &pFVar12->super_PtexFaceData;
      }
    }
  }
  local_38._val =
       CONCAT44(faceid,(((int)cVar20 | uVar21 & 0xffffff00) << 0x10 ^ faceid) * 0x1000193);
  pFVar12 = PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
            get(&this->_reductions,&local_38);
  if (pFVar12 != (FaceData *)0x0) {
    return &pFVar12->super_PtexFaceData;
  }
  local_50 = 0;
  if (((ushort)res & 0x8080) == 0) {
    if ((int)(levelid_00 | local_44) < 0) {
      pcVar19 = "PtexReader::getData - enlargements not supported";
      lVar18 = 0x30;
    }
    else {
      uVar9 = uVar21 & 0x7f00;
      if ((this->_header).meshtype != 0) {
        uVar13 = (ulong)(local_44 < levelid_00);
        if (levelid_00 == local_44) {
          uVar13 = uVar16 & 0xffffffff;
        }
        if ((uVar13 & 1) == 0) {
          iVar10 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                             (this,uVar7,(ulong)(uVar9 + (uVar21 & 0x7f) + 0x100));
          plVar15 = (long *)CONCAT44(extraout_var_00,iVar10);
          pFVar12 = (FaceData *)
                    (**(code **)(*plVar15 + 0x50))
                              (plVar15,this,uVar16 & 0xffffffff,PtexUtils::reducev,&local_50);
          (**(code **)(*plVar15 + 0x10))(plVar15);
        }
        else {
          iVar10 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                             (this,uVar7,(ulong)(uVar9 | uVar21 + 1 & 0xff));
          plVar15 = (long *)CONCAT44(extraout_var,iVar10);
          pFVar12 = (FaceData *)
                    (**(code **)(*plVar15 + 0x50))
                              (plVar15,this,uVar16 & 0xffffffff,PtexUtils::reduceu,&local_50);
          (**(code **)(*plVar15 + 0x10))(plVar15);
        }
        goto LAB_00108f56;
      }
      if (levelid_00 == local_44) {
        iVar10 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                           (this,uVar7,(ulong)(uVar9 + (uVar21 + 1 & 0xff) + 0x100));
        plVar15 = (long *)CONCAT44(extraout_var_01,iVar10);
        pFVar12 = (FaceData *)
                  (**(code **)(*plVar15 + 0x50))
                            (plVar15,this,uVar16 & 0xffffffff,PtexUtils::reduceTri,&local_50);
        (**(code **)(*plVar15 + 0x10))(plVar15);
        goto LAB_00108f56;
      }
      pcVar19 = "PtexReader::getData - anisotropic reductions not supported for triangle mesh";
      lVar18 = 0x4c;
    }
  }
  else {
    pcVar19 = "PtexReader::getData - reductions below 1 pixel not supported";
    lVar18 = 0x3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar19,lVar18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  pFVar12 = errorData(this,false);
LAB_00108f56:
  local_40 = 0;
  pFVar14 = PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
            tryInsert(&this->_reductions,&local_38,pFVar12,&local_40);
  if (pFVar14 == pFVar12) {
    if (local_40 + local_50 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + local_40 + local_50;
      UNLOCK();
    }
  }
  else if (pFVar12 != (FaceData *)0x0) {
    (*(pFVar12->super_PtexFaceData)._vptr_PtexFaceData[1])(pFVar12);
  }
  return &pFVar14->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // determine how many reduction levels are needed
    int redu = fi.res.ulog2 - res.ulog2, redv = fi.res.vlog2 - res.vlog2;

    if (redu == 0 && redv == 0) {
        // no reduction - get level zero (full) res face
        Level* level = getLevel(0);
        FaceData* face = getFace(0, level, faceid, res);
        return face;
    }

    if (redu == redv && !fi.hasEdits()) {
        // reduction is symmetric and non-negative
        // and face has no edits => access data from reduction level (if present)
        int levelid = redu;
        if (size_t(levelid) < _levels.size()) {
            Level* level = getLevel(levelid);

            // get reduction face id
            int rfaceid = _rfaceids[faceid];

            // get the face data (if present)
            FaceData* face = 0;
            if (size_t(rfaceid) < level->faces.size()) {
                face = getFace(levelid, level, rfaceid, res);
            }
            if (face) {
                return face;
            }
        }
    }

    // dynamic reduction required - look in dynamic reduction cache
    ReductionKey key(faceid, res);
    FaceData* face = _reductions.get(key);
    if (face) {
        return face;
    }

    // not found,  generate new reduction
    FaceData *newface = 0;
    size_t newMemUsed = 0;

    if (res.ulog2 < 0 || res.vlog2 < 0) {
        std::cerr << "PtexReader::getData - reductions below 1 pixel not supported" << std::endl;
        newface = errorData();
    }
    else if (redu < 0 || redv < 0) {
        std::cerr << "PtexReader::getData - enlargements not supported" << std::endl;
        newface = errorData();
    }
    else if (_header.meshtype == mt_triangle)
    {
        if (redu != redv) {
            std::cerr << "PtexReader::getData - anisotropic reductions not supported for triangle mesh" << std::endl;
            newface = errorData();
        }
        else {
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceTri, newMemUsed);
        }
    }
    else {
        // determine which direction to blend
        bool blendu;
        if (redu == redv) {
            // for symmetric face blends, alternate u and v blending
            blendu = (res.ulog2 & 1);
        }
        else blendu = redu > redv;

        if (blendu) {
            // get next-higher u-res and reduce in u
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)res.vlog2)) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceu, newMemUsed);
        }
        else {
            // get next-higher v-res and reduce in v
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)res.ulog2, (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reducev, newMemUsed);
        }
    }

    size_t tableNewMemUsed = 0;
    face = _reductions.tryInsert(key, newface, tableNewMemUsed);
    if (face != newface) {
        delete newface;
    }
    else {
        increaseMemUsed(newMemUsed + tableNewMemUsed);
    }
    return face;
}